

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O0

int __thiscall VanEmdeBoasTree::remove(VanEmdeBoasTree *this,char *__filename)

{
  Node *this_00;
  long lVar1;
  long *plVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  undefined7 extraout_var;
  long lVar6;
  uint in_EDX;
  int local_38;
  int local_34;
  int i_1;
  int tmp_1;
  int tmp;
  int highVal;
  int i;
  int value_local;
  Node **root_local;
  VanEmdeBoasTree *this_local;
  
  if (*(long *)__filename == 0) {
    this_local._7_1_ = 0;
  }
  else {
    plVar2 = (long *)__filename;
    if (((int)in_EDX < 0) || (plVar2 = (long *)(ulong)in_EDX, **(int **)__filename <= (int)in_EDX))
    {
      __filename = (char *)plVar2;
      this_local._7_1_ = 0;
    }
    else {
      uVar4 = *(uint *)(*(long *)__filename + 0x10);
      if (((int)in_EDX < (int)uVar4) ||
         (uVar4 = *(uint *)(*(long *)__filename + 0x14), (int)uVar4 < (int)in_EDX)) {
        __filename = (char *)(ulong)uVar4;
        this_local._7_1_ = 0;
      }
      else {
        highVal = in_EDX;
        _i = (long *)__filename;
        root_local = &this->root;
        if (*(uint *)(*(long *)__filename + 0x10) == in_EDX) {
          bVar3 = findMin(this,*(Node **)(*(long *)__filename + 0x18),&tmp);
          if ((!bVar3) || (tmp == -0x80000000)) {
            if (*(int *)(*_i + 0x10) == *(int *)(*_i + 0x14)) {
              *(undefined4 *)(*_i + 0x14) = 0x80000000;
              *(undefined4 *)(*_i + 0x10) = 0x80000000;
              this_00 = (Node *)*_i;
              if (this_00 != (Node *)0x0) {
                Node::~Node(this_00);
                operator_delete(this_00,0x28);
              }
              *_i = 0;
              this_local._7_1_ = 1;
              __filename = (char *)_i;
            }
            else {
              __filename = (char *)*_i;
              *(undefined4 *)((long)__filename + 0x10) = *(undefined4 *)(*_i + 0x14);
              this_local._7_1_ = 1;
            }
            goto LAB_0010f684;
          }
          pcVar5 = index(this,(char *)*_i,tmp);
          highVal = (int)pcVar5;
          *(int *)(*_i + 0x10) = highVal;
        }
        if (2 < *(int *)*_i) {
          tmp_1 = high(this,(Node *)*_i,highVal);
          lVar1 = *(long *)(*_i + 0x20);
          lVar6 = (long)tmp_1;
          low(this,(Node *)*_i,highVal);
          uVar4 = remove(this,(char *)(lVar1 + lVar6 * 8));
          __filename = (char *)(ulong)uVar4;
          if ((uVar4 & 1) == 0) {
            this_local._7_1_ = 0;
            goto LAB_0010f684;
          }
          bVar3 = findMin(this,*(Node **)(*(long *)(*_i + 0x20) + (long)tmp_1 * 8),&i_1);
          if ((!bVar3) || (i_1 == -0x80000000)) {
            uVar4 = remove(this,(char *)(*_i + 0x18));
            __filename = (char *)(ulong)uVar4;
            if ((uVar4 & 1) == 0) {
              this_local._7_1_ = 0;
              goto LAB_0010f684;
            }
          }
        }
        __filename = (char *)(ulong)*(uint *)(*_i + 0x14);
        if (*(uint *)(*_i + 0x14) == highVal) {
          bVar3 = findMax(this,*(Node **)(*_i + 0x18),&local_34);
          if ((bVar3) && (local_34 != -0x80000000)) {
            bVar3 = findMax(this,*(Node **)(*_i + 0x18),&local_38);
            __filename = (char *)CONCAT71(extraout_var,bVar3);
            if (!bVar3) {
              this_local._7_1_ = 0;
              goto LAB_0010f684;
            }
            pcVar5 = index(this,(char *)*_i,local_38);
            __filename = (char *)*_i;
            *(int *)((long)__filename + 0x14) = (int)pcVar5;
          }
          else {
            __filename = (char *)*_i;
            *(undefined4 *)((long)__filename + 0x14) = *(undefined4 *)(*_i + 0x10);
          }
        }
        this_local._7_1_ = 1;
      }
    }
  }
LAB_0010f684:
  return (int)CONCAT71((int7)((ulong)__filename >> 8),this_local._7_1_);
}

Assistant:

bool VanEmdeBoasTree::remove(Node *&root, int value) {
    if (!root) {
        return false;
    }

    if (value < 0 || value >= root->uni) {
        return false;
    }
    if (root->min > value || root->max < value) {
        return false;
    }

    if (root->min == value) {
        int i;
        if (!findMin(root->summary, i) || i == INT_MIN) {
            if (root->min != root->max) {
                root->min = root->max;
                return true;
            }

            root->min = root->max = INT_MIN;
            delete root;
            root = nullptr;
            return true;
        }
        value = root->min = index(root, i, root->cluster[i]->min);
    }

    if (root->uni > 2) {
        int highVal = high(root, value);
        if (!remove(root->cluster[highVal], low(root, value))) {
            return false;
        }

        int tmp;
        if (!findMin(root->cluster[highVal], tmp) || tmp == INT_MIN) {
            if (!remove(root->summary, highVal)) {
                return false;
            }
        }
    }

    if (root->max == value) {
        int tmp;
        if (!findMax(root->summary, tmp) || tmp == INT_MIN) {
            root->max = root->min;
        } else {
            int i;
            if (!findMax(root->summary, i)) {
                return false;
            }
            root->max = index(root, i, root->cluster[i]->max);
        }
    }
    return true;
}